

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_tests.cc
# Opt level: O0

void __thiscall PointTest_Add_Test::~PointTest_Add_Test(PointTest_Add_Test *this)

{
  PointTest_Add_Test *this_local;
  
  ~PointTest_Add_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PointTest, Add)
{
    point_t p1, p2, p3;

    point_new(&p3);
    point_init(&p1, 3, 0);
    point_init(&p2, 0, 4);
    point_add(&p3, &p1);
    point_add(&p3, &p2);
    ASSERT_FLOAT_EQ( point_x(&p3), 3.0);
    ASSERT_FLOAT_EQ( point_y(&p3), 4.0);
}